

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O0

int to_speex_quality(cubeb_resampler_quality q)

{
  cubeb_resampler_quality q_local;
  undefined4 local_4;
  
  if (q == CUBEB_RESAMPLER_QUALITY_VOIP) {
    local_4 = 3;
  }
  else if (q == CUBEB_RESAMPLER_QUALITY_DEFAULT) {
    local_4 = 4;
  }
  else if (q == CUBEB_RESAMPLER_QUALITY_DESKTOP) {
    local_4 = 5;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int
to_speex_quality(cubeb_resampler_quality q)
{
  switch (q) {
  case CUBEB_RESAMPLER_QUALITY_VOIP:
    return SPEEX_RESAMPLER_QUALITY_VOIP;
  case CUBEB_RESAMPLER_QUALITY_DEFAULT:
    return SPEEX_RESAMPLER_QUALITY_DEFAULT;
  case CUBEB_RESAMPLER_QUALITY_DESKTOP:
    return SPEEX_RESAMPLER_QUALITY_DESKTOP;
  default:
    assert(false);
    return 0XFFFFFFFF;
  }
}